

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O1

string_view __thiscall
absl::lts_20240722::cord_internal::CordRepBtreeReader::Seek(CordRepBtreeReader *this,size_t offset)

{
  byte bVar1;
  CordRepBtree *pCVar2;
  CordRep *pCVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  CordRep *pCVar8;
  uint8_t *puVar9;
  Position PVar10;
  string_view sVar11;
  
  PVar10 = CordRepBtreeNavigator::Seek(&this->navigator_,offset);
  uVar7 = PVar10.offset;
  pCVar3 = PVar10.edge;
  if (pCVar3 == (CordRep *)0x0) {
    sVar6 = 0;
    puVar9 = (uint8_t *)0x0;
    sVar4 = 0;
  }
  else {
    bVar1 = pCVar3->tag;
    if (bVar1 < 5) {
      pCVar8 = pCVar3;
      if (bVar1 == 1) {
        pCVar8 = *(CordRep **)&pCVar3[1].refcount;
      }
      if (pCVar8->tag < 5) goto LAB_00112aff;
    }
    if (bVar1 == 1) {
      sVar6 = pCVar3[1].length;
      pCVar8 = *(CordRep **)&pCVar3[1].refcount;
    }
    else {
      sVar6 = 0;
      pCVar8 = pCVar3;
    }
    bVar1 = pCVar8->tag;
    if (bVar1 < 6) {
      if (bVar1 != 5) {
        __assert_fail("IsExternal()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x369,"const CordRepExternal *absl::cord_internal::CordRep::external() const"
                     );
      }
      puVar9 = (uint8_t *)pCVar8[1].length;
    }
    else {
      if ((bVar1 - 0xf9 < 7) || (bVar1 < 6)) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
      }
      puVar9 = pCVar8->storage;
    }
    sVar4 = pCVar3->length - uVar7;
    if (pCVar3->length < uVar7) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
LAB_00112aff:
      __assert_fail("IsDataEdge(edge)",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                    ,0x2e,"absl::string_view absl::cord_internal::EdgeData(const CordRep *)");
    }
    lVar5 = (long)(this->navigator_).height_;
    if ((lVar5 < 0) || (pCVar2 = (this->navigator_).node_[lVar5], pCVar2 == (CordRepBtree *)0x0)) {
      __assert_fail("btree() != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_reader.h"
                    ,0xa3,"size_t absl::cord_internal::CordRepBtreeReader::length() const");
    }
    puVar9 = puVar9 + uVar7 + sVar6;
    sVar6 = (pCVar2->super_CordRep).length - (offset + sVar4);
  }
  this->remaining_ = sVar6;
  sVar11._M_str = (char *)puVar9;
  sVar11._M_len = sVar4;
  return sVar11;
}

Assistant:

inline absl::string_view CordRepBtreeReader::Seek(size_t offset) {
  const CordRepBtreeNavigator::Position pos = navigator_.Seek(offset);
  if (ABSL_PREDICT_FALSE(pos.edge == nullptr)) {
    remaining_ = 0;
    return {};
  }
  absl::string_view chunk = EdgeData(pos.edge).substr(pos.offset);
  remaining_ = length() - offset - chunk.length();
  return chunk;
}